

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O1

bool embree::avx2::
     BVHNIntersectorKHybrid<4,_8,_1,_true,_embree::avx2::ArrayIntersectorK_1<8,_embree::avx2::QuadMvIntersectorKPluecker<4,_8,_true>_>,_true>
     ::occluded1(Intersectors *This,BVH *bvh,NodeRef root,size_t k,Precalculations *pre,RayK<8> *ray
                ,TravRayK<8,_true> *tray,RayQueryContext *context)

{
  float fVar1;
  float fVar2;
  float fVar3;
  undefined4 uVar4;
  Scene *pSVar5;
  Geometry *pGVar6;
  RTCFilterFunctionN p_Var7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  float fVar26;
  float fVar27;
  float fVar28;
  float fVar29;
  float fVar30;
  float fVar31;
  float fVar32;
  undefined1 auVar33 [16];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  ulong uVar37;
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  bool bVar56;
  bool bVar57;
  bool bVar58;
  bool bVar59;
  bool bVar60;
  bool bVar61;
  bool bVar62;
  bool bVar63;
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  int iVar66;
  ulong uVar67;
  long lVar68;
  long lVar69;
  ulong uVar70;
  ulong uVar71;
  ulong uVar72;
  ulong uVar73;
  ulong *puVar74;
  ulong *puVar75;
  ulong uVar76;
  ulong uVar77;
  ulong uVar78;
  uint uVar79;
  undefined4 uVar80;
  ulong unaff_R14;
  size_t mask;
  bool bVar81;
  bool bVar82;
  undefined1 auVar83 [16];
  undefined1 auVar84 [32];
  undefined1 auVar85 [32];
  undefined1 auVar86 [32];
  undefined1 auVar87 [32];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined8 extraout_XMM1_Qa;
  undefined1 auVar91 [32];
  undefined1 auVar92 [32];
  undefined1 auVar93 [32];
  undefined1 auVar94 [32];
  undefined1 auVar95 [32];
  undefined1 extraout_var [56];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [32];
  undefined1 auVar100 [32];
  undefined1 auVar101 [32];
  undefined1 auVar102 [32];
  undefined1 auVar103 [32];
  undefined1 auVar104 [16];
  undefined1 auVar105 [32];
  undefined1 auVar106 [32];
  undefined1 auVar107 [16];
  undefined1 auVar108 [32];
  undefined1 auVar109 [32];
  undefined1 auVar110 [32];
  undefined1 auVar111 [32];
  float fVar112;
  float fVar116;
  float fVar117;
  float fVar118;
  float fVar119;
  float fVar120;
  undefined1 auVar113 [32];
  undefined1 auVar114 [32];
  undefined1 auVar115 [32];
  undefined1 auVar121 [32];
  undefined1 auVar122 [32];
  undefined1 auVar123 [16];
  undefined1 auVar124 [32];
  undefined1 auVar125 [32];
  float fVar126;
  float fVar130;
  float fVar131;
  undefined1 auVar127 [16];
  float fVar133;
  float fVar134;
  float fVar135;
  undefined1 auVar128 [32];
  float fVar132;
  undefined1 auVar129 [32];
  undefined1 auVar136 [16];
  undefined1 auVar137 [32];
  undefined1 auVar138 [32];
  undefined1 auVar139 [32];
  undefined1 auVar140 [32];
  undefined1 auVar141 [32];
  undefined1 auVar142 [32];
  undefined1 auVar143 [32];
  RTCFilterFunctionNArguments args;
  NodeRef stack [244];
  RTCFilterFunctionNArguments local_cd0;
  undefined1 local_ca0 [32];
  undefined1 local_c80 [32];
  undefined8 local_c60;
  undefined8 uStack_c58;
  undefined8 uStack_c50;
  undefined8 uStack_c48;
  undefined1 local_c40 [32];
  undefined1 local_c20 [8];
  float fStack_c18;
  float fStack_c14;
  float fStack_c10;
  float fStack_c0c;
  float fStack_c08;
  undefined4 uStack_c04;
  undefined1 local_c00 [32];
  undefined1 local_be0 [32];
  undefined1 local_bc0 [32];
  undefined1 local_ba0 [32];
  undefined1 local_b80 [32];
  undefined1 local_b60 [32];
  float local_b40;
  float fStack_b3c;
  float fStack_b38;
  float fStack_b34;
  float fStack_b30;
  float fStack_b2c;
  float fStack_b28;
  float fStack_b24;
  undefined8 local_b20;
  undefined8 uStack_b18;
  undefined8 uStack_b10;
  undefined8 uStack_b08;
  undefined8 local_b00;
  undefined8 uStack_af8;
  undefined8 uStack_af0;
  undefined8 uStack_ae8;
  float local_ae0;
  float fStack_adc;
  float fStack_ad8;
  float fStack_ad4;
  undefined4 uStack_ad0;
  undefined4 uStack_acc;
  undefined4 uStack_ac8;
  undefined4 uStack_ac4;
  undefined1 local_ac0 [32];
  undefined1 local_aa0 [32];
  undefined1 local_a80 [32];
  undefined1 local_a60 [32];
  undefined1 local_a40 [32];
  undefined1 local_a20 [32];
  undefined1 local_a00 [32];
  undefined1 local_9e0 [32];
  undefined1 local_9c0 [32];
  float local_9a0 [4];
  float fStack_990;
  float fStack_98c;
  float fStack_988;
  undefined4 uStack_984;
  undefined1 local_980 [32];
  float local_960 [4];
  float fStack_950;
  float fStack_94c;
  float fStack_948;
  undefined4 uStack_944;
  undefined1 local_940 [32];
  undefined4 local_920;
  undefined4 uStack_91c;
  undefined4 uStack_918;
  undefined4 uStack_914;
  undefined4 uStack_910;
  undefined4 uStack_90c;
  undefined4 uStack_908;
  undefined4 uStack_904;
  undefined1 local_900 [32];
  undefined1 local_8e0 [32];
  undefined4 local_8c0;
  undefined4 uStack_8bc;
  undefined4 uStack_8b8;
  undefined4 uStack_8b4;
  undefined4 uStack_8b0;
  undefined4 uStack_8ac;
  undefined4 uStack_8a8;
  undefined4 uStack_8a4;
  undefined1 local_8a0 [32];
  undefined4 local_880;
  undefined4 uStack_87c;
  undefined4 uStack_878;
  undefined4 uStack_874;
  undefined4 uStack_870;
  undefined4 uStack_86c;
  undefined4 uStack_868;
  undefined4 uStack_864;
  undefined1 local_860 [32];
  uint local_840;
  uint uStack_83c;
  uint uStack_838;
  uint uStack_834;
  uint uStack_830;
  uint uStack_82c;
  uint uStack_828;
  uint uStack_824;
  uint local_820;
  uint uStack_81c;
  uint uStack_818;
  uint uStack_814;
  uint uStack_810;
  uint uStack_80c;
  uint uStack_808;
  uint uStack_804;
  size_t local_800;
  ulong local_7f8 [249];
  undefined1 auVar96 [64];
  
  local_800 = root.ptr;
  uVar80 = *(undefined4 *)((long)&(tray->org).field_0 + k * 4);
  auVar123._4_4_ = uVar80;
  auVar123._0_4_ = uVar80;
  auVar123._8_4_ = uVar80;
  auVar123._12_4_ = uVar80;
  uVar80 = *(undefined4 *)((long)&(tray->org).field_0 + k * 4 + 0x20);
  auVar127._4_4_ = uVar80;
  auVar127._0_4_ = uVar80;
  auVar127._8_4_ = uVar80;
  auVar127._12_4_ = uVar80;
  uVar80 = *(undefined4 *)((long)&(tray->org).field_0 + k * 4 + 0x40);
  auVar136._4_4_ = uVar80;
  auVar136._0_4_ = uVar80;
  auVar136._8_4_ = uVar80;
  auVar136._12_4_ = uVar80;
  fVar1 = *(float *)((long)&(tray->rdir).field_0 + k * 4);
  fVar2 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x20);
  fVar3 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x40);
  fVar30 = fVar1 * 0.99999964;
  fVar31 = fVar2 * 0.99999964;
  fVar32 = fVar3 * 0.99999964;
  fVar1 = fVar1 * 1.0000004;
  fVar2 = fVar2 * 1.0000004;
  fVar3 = fVar3 * 1.0000004;
  uVar76 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4);
  uVar77 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x20);
  uVar71 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x40);
  iVar66 = (tray->tnear).field_0.i[k];
  auVar104._4_4_ = iVar66;
  auVar104._0_4_ = iVar66;
  auVar104._8_4_ = iVar66;
  auVar104._12_4_ = iVar66;
  iVar66 = (tray->tfar).field_0.i[k];
  auVar107._4_4_ = iVar66;
  auVar107._0_4_ = iVar66;
  auVar107._8_4_ = iVar66;
  auVar107._12_4_ = iVar66;
  local_c00._16_16_ = mm_lookupmask_ps._240_16_;
  local_c00._0_16_ = mm_lookupmask_ps._0_16_;
  iVar66 = 1 << ((uint)k & 0x1f);
  auVar84._4_4_ = iVar66;
  auVar84._0_4_ = iVar66;
  auVar84._8_4_ = iVar66;
  auVar84._12_4_ = iVar66;
  auVar84._16_4_ = iVar66;
  auVar84._20_4_ = iVar66;
  auVar84._24_4_ = iVar66;
  auVar84._28_4_ = iVar66;
  auVar85 = vpmovzxbd_avx2(ZEXT816(0x8040201008040201));
  auVar84 = vpand_avx2(auVar84,auVar85);
  local_c40 = vpcmpeqd_avx2(auVar84,auVar85);
  auVar91._8_4_ = 0x3f800000;
  auVar91._0_8_ = &DAT_3f8000003f800000;
  auVar91._12_4_ = 0x3f800000;
  auVar91._16_4_ = 0x3f800000;
  auVar91._20_4_ = 0x3f800000;
  auVar91._24_4_ = 0x3f800000;
  auVar91._28_4_ = 0x3f800000;
  auVar85._8_4_ = 0xbf800000;
  auVar85._0_8_ = 0xbf800000bf800000;
  auVar85._12_4_ = 0xbf800000;
  auVar85._16_4_ = 0xbf800000;
  auVar85._20_4_ = 0xbf800000;
  auVar85._24_4_ = 0xbf800000;
  auVar85._28_4_ = 0xbf800000;
  _local_c20 = vblendvps_avx(auVar91,auVar85,local_c00);
  puVar75 = local_7f8;
  do {
    puVar74 = puVar75;
    if (puVar74 == &local_800) break;
    puVar75 = puVar74 + -1;
    uVar73 = puVar74[-1];
    do {
      if ((uVar73 & 8) == 0) {
        auVar33 = vsubps_avx(*(undefined1 (*) [16])(uVar73 + 0x20 + uVar76),auVar123);
        auVar83._0_4_ = fVar30 * auVar33._0_4_;
        auVar83._4_4_ = fVar30 * auVar33._4_4_;
        auVar83._8_4_ = fVar30 * auVar33._8_4_;
        auVar83._12_4_ = fVar30 * auVar33._12_4_;
        auVar33 = vsubps_avx(*(undefined1 (*) [16])(uVar73 + 0x20 + uVar77),auVar127);
        auVar88._0_4_ = fVar31 * auVar33._0_4_;
        auVar88._4_4_ = fVar31 * auVar33._4_4_;
        auVar88._8_4_ = fVar31 * auVar33._8_4_;
        auVar88._12_4_ = fVar31 * auVar33._12_4_;
        auVar33 = vmaxps_avx(auVar83,auVar88);
        auVar83 = vsubps_avx(*(undefined1 (*) [16])(uVar73 + 0x20 + uVar71),auVar136);
        auVar89._0_4_ = fVar32 * auVar83._0_4_;
        auVar89._4_4_ = fVar32 * auVar83._4_4_;
        auVar89._8_4_ = fVar32 * auVar83._8_4_;
        auVar89._12_4_ = fVar32 * auVar83._12_4_;
        auVar83 = vmaxps_avx(auVar89,auVar104);
        auVar33 = vmaxps_avx(auVar33,auVar83);
        auVar83 = vsubps_avx(*(undefined1 (*) [16])(uVar73 + 0x20 + (uVar76 ^ 0x10)),auVar123);
        auVar90._0_4_ = fVar1 * auVar83._0_4_;
        auVar90._4_4_ = fVar1 * auVar83._4_4_;
        auVar90._8_4_ = fVar1 * auVar83._8_4_;
        auVar90._12_4_ = fVar1 * auVar83._12_4_;
        auVar83 = vsubps_avx(*(undefined1 (*) [16])(uVar73 + 0x20 + (uVar77 ^ 0x10)),auVar127);
        auVar97._0_4_ = fVar2 * auVar83._0_4_;
        auVar97._4_4_ = fVar2 * auVar83._4_4_;
        auVar97._8_4_ = fVar2 * auVar83._8_4_;
        auVar97._12_4_ = fVar2 * auVar83._12_4_;
        auVar83 = vminps_avx(auVar90,auVar97);
        auVar88 = vsubps_avx(*(undefined1 (*) [16])(uVar73 + 0x20 + (uVar71 ^ 0x10)),auVar136);
        auVar98._0_4_ = fVar3 * auVar88._0_4_;
        auVar98._4_4_ = fVar3 * auVar88._4_4_;
        auVar98._8_4_ = fVar3 * auVar88._8_4_;
        auVar98._12_4_ = fVar3 * auVar88._12_4_;
        auVar88 = vminps_avx(auVar98,auVar107);
        auVar83 = vminps_avx(auVar83,auVar88);
        auVar33 = vcmpps_avx(auVar33,auVar83,2);
        uVar80 = vmovmskps_avx(auVar33);
        unaff_R14 = CONCAT44((int)(unaff_R14 >> 0x20),uVar80);
      }
      if ((uVar73 & 8) == 0) {
        if (unaff_R14 == 0) {
          uVar79 = 4;
        }
        else {
          uVar72 = uVar73 & 0xfffffffffffffff0;
          lVar69 = 0;
          for (uVar73 = unaff_R14; (uVar73 & 1) == 0; uVar73 = uVar73 >> 1 | 0x8000000000000000) {
            lVar69 = lVar69 + 1;
          }
          uVar79 = 0;
          for (uVar67 = unaff_R14 - 1 & unaff_R14; uVar73 = *(ulong *)(uVar72 + lVar69 * 8),
              uVar67 != 0; uVar67 = uVar67 - 1 & uVar67) {
            *puVar75 = uVar73;
            puVar75 = puVar75 + 1;
            lVar69 = 0;
            for (uVar73 = uVar67; (uVar73 & 1) == 0; uVar73 = uVar73 >> 1 | 0x8000000000000000) {
              lVar69 = lVar69 + 1;
            }
          }
        }
      }
      else {
        uVar79 = 6;
      }
    } while (uVar79 == 0);
    if (uVar79 == 6) {
      uVar72 = (ulong)((uint)uVar73 & 0xf);
      uVar79 = 0;
      uVar67 = uVar72 - 8;
      bVar81 = uVar72 != 8;
      if (bVar81) {
        uVar73 = uVar73 & 0xfffffffffffffff0;
        uVar72 = 0;
        do {
          lVar68 = uVar72 * 0xe0;
          lVar69 = uVar73 + 0xd0 + lVar68;
          local_b20 = *(undefined8 *)(lVar69 + 0x10);
          uStack_b18 = *(undefined8 *)(lVar69 + 0x18);
          lVar69 = uVar73 + 0xc0 + lVar68;
          local_b00 = *(undefined8 *)(lVar69 + 0x10);
          uStack_af8 = *(undefined8 *)(lVar69 + 0x18);
          uStack_af0 = local_b00;
          uStack_ae8 = uStack_af8;
          uStack_b10 = local_b20;
          uStack_b08 = uStack_b18;
          auVar86._16_16_ = *(undefined1 (*) [16])(uVar73 + 0x60 + lVar68);
          auVar86._0_16_ = *(undefined1 (*) [16])(uVar73 + lVar68);
          auVar92._16_16_ = *(undefined1 (*) [16])(uVar73 + 0x70 + lVar68);
          auVar92._0_16_ = *(undefined1 (*) [16])(uVar73 + 0x10 + lVar68);
          auVar99._16_16_ = *(undefined1 (*) [16])(uVar73 + 0x80 + lVar68);
          auVar99._0_16_ = *(undefined1 (*) [16])(uVar73 + 0x20 + lVar68);
          auVar33 = *(undefined1 (*) [16])(uVar73 + 0x30 + lVar68);
          auVar105._16_16_ = auVar33;
          auVar105._0_16_ = auVar33;
          auVar33 = *(undefined1 (*) [16])(uVar73 + 0x40 + lVar68);
          auVar108._16_16_ = auVar33;
          auVar108._0_16_ = auVar33;
          auVar33 = *(undefined1 (*) [16])(uVar73 + 0x50 + lVar68);
          auVar113._16_16_ = auVar33;
          auVar113._0_16_ = auVar33;
          auVar33 = *(undefined1 (*) [16])(uVar73 + 0x90 + lVar68);
          auVar121._16_16_ = auVar33;
          auVar121._0_16_ = auVar33;
          auVar33 = *(undefined1 (*) [16])(uVar73 + 0xa0 + lVar68);
          auVar143._16_16_ = auVar33;
          auVar143._0_16_ = auVar33;
          auVar33 = *(undefined1 (*) [16])(uVar73 + 0xb0 + lVar68);
          auVar124._16_16_ = auVar33;
          auVar124._0_16_ = auVar33;
          uVar80 = *(undefined4 *)(ray + k * 4);
          auVar139._4_4_ = uVar80;
          auVar139._0_4_ = uVar80;
          auVar139._8_4_ = uVar80;
          auVar139._12_4_ = uVar80;
          auVar139._16_4_ = uVar80;
          auVar139._20_4_ = uVar80;
          auVar139._24_4_ = uVar80;
          auVar139._28_4_ = uVar80;
          uVar80 = *(undefined4 *)(ray + k * 4 + 0x20);
          auVar140._4_4_ = uVar80;
          auVar140._0_4_ = uVar80;
          auVar140._8_4_ = uVar80;
          auVar140._12_4_ = uVar80;
          auVar140._16_4_ = uVar80;
          auVar140._20_4_ = uVar80;
          auVar140._24_4_ = uVar80;
          auVar140._28_4_ = uVar80;
          uVar4 = *(undefined4 *)(ray + k * 4 + 0x40);
          auVar141._4_4_ = uVar4;
          auVar141._0_4_ = uVar4;
          auVar141._8_4_ = uVar4;
          auVar141._12_4_ = uVar4;
          auVar141._16_4_ = uVar4;
          auVar141._20_4_ = uVar4;
          auVar141._24_4_ = uVar4;
          auVar141._28_4_ = uVar4;
          local_c80 = vsubps_avx(auVar86,auVar139);
          auVar86 = vsubps_avx(auVar92,auVar140);
          auVar84 = vsubps_avx(auVar99,auVar141);
          auVar85 = vsubps_avx(auVar105,auVar139);
          auVar91 = vsubps_avx(auVar108,auVar140);
          auVar34 = vsubps_avx(auVar113,auVar141);
          auVar92 = vsubps_avx(auVar121,auVar139);
          auVar99 = vsubps_avx(auVar143,auVar140);
          auVar35 = vsubps_avx(auVar124,auVar141);
          auVar105 = vsubps_avx(auVar92,local_c80);
          local_ca0 = vsubps_avx(auVar99,auVar86);
          auVar108 = vsubps_avx(auVar35,auVar84);
          auVar87._0_4_ = auVar92._0_4_ + local_c80._0_4_;
          auVar87._4_4_ = auVar92._4_4_ + local_c80._4_4_;
          auVar87._8_4_ = auVar92._8_4_ + local_c80._8_4_;
          auVar87._12_4_ = auVar92._12_4_ + local_c80._12_4_;
          auVar87._16_4_ = auVar92._16_4_ + local_c80._16_4_;
          auVar87._20_4_ = auVar92._20_4_ + local_c80._20_4_;
          auVar87._24_4_ = auVar92._24_4_ + local_c80._24_4_;
          auVar87._28_4_ = auVar92._28_4_ + local_c80._28_4_;
          auVar106._0_4_ = auVar99._0_4_ + auVar86._0_4_;
          auVar106._4_4_ = auVar99._4_4_ + auVar86._4_4_;
          auVar106._8_4_ = auVar99._8_4_ + auVar86._8_4_;
          auVar106._12_4_ = auVar99._12_4_ + auVar86._12_4_;
          auVar106._16_4_ = auVar99._16_4_ + auVar86._16_4_;
          auVar106._20_4_ = auVar99._20_4_ + auVar86._20_4_;
          auVar106._24_4_ = auVar99._24_4_ + auVar86._24_4_;
          auVar106._28_4_ = auVar99._28_4_ + auVar86._28_4_;
          fVar8 = auVar84._0_4_;
          auVar109._0_4_ = auVar35._0_4_ + fVar8;
          fVar9 = auVar84._4_4_;
          auVar109._4_4_ = auVar35._4_4_ + fVar9;
          fVar10 = auVar84._8_4_;
          auVar109._8_4_ = auVar35._8_4_ + fVar10;
          fVar11 = auVar84._12_4_;
          auVar109._12_4_ = auVar35._12_4_ + fVar11;
          fVar12 = auVar84._16_4_;
          auVar109._16_4_ = auVar35._16_4_ + fVar12;
          fVar13 = auVar84._20_4_;
          auVar109._20_4_ = auVar35._20_4_ + fVar13;
          fVar14 = auVar84._24_4_;
          fVar130 = auVar35._28_4_;
          auVar109._24_4_ = auVar35._24_4_ + fVar14;
          fVar112 = auVar84._28_4_;
          auVar109._28_4_ = fVar130 + fVar112;
          auVar36._4_4_ = auVar108._4_4_ * auVar106._4_4_;
          auVar36._0_4_ = auVar108._0_4_ * auVar106._0_4_;
          auVar36._8_4_ = auVar108._8_4_ * auVar106._8_4_;
          auVar36._12_4_ = auVar108._12_4_ * auVar106._12_4_;
          auVar36._16_4_ = auVar108._16_4_ * auVar106._16_4_;
          auVar36._20_4_ = auVar108._20_4_ * auVar106._20_4_;
          auVar36._24_4_ = auVar108._24_4_ * auVar106._24_4_;
          auVar36._28_4_ = uVar80;
          auVar83 = vfmsub231ps_fma(auVar36,local_ca0,auVar109);
          auVar38._4_4_ = auVar109._4_4_ * auVar105._4_4_;
          auVar38._0_4_ = auVar109._0_4_ * auVar105._0_4_;
          auVar38._8_4_ = auVar109._8_4_ * auVar105._8_4_;
          auVar38._12_4_ = auVar109._12_4_ * auVar105._12_4_;
          auVar38._16_4_ = auVar109._16_4_ * auVar105._16_4_;
          auVar38._20_4_ = auVar109._20_4_ * auVar105._20_4_;
          auVar38._24_4_ = auVar109._24_4_ * auVar105._24_4_;
          auVar38._28_4_ = auVar109._28_4_;
          auVar33 = vfmsub231ps_fma(auVar38,auVar108,auVar87);
          auVar39._4_4_ = auVar87._4_4_ * local_ca0._4_4_;
          auVar39._0_4_ = auVar87._0_4_ * local_ca0._0_4_;
          auVar39._8_4_ = auVar87._8_4_ * local_ca0._8_4_;
          auVar39._12_4_ = auVar87._12_4_ * local_ca0._12_4_;
          auVar39._16_4_ = auVar87._16_4_ * local_ca0._16_4_;
          auVar39._20_4_ = auVar87._20_4_ * local_ca0._20_4_;
          auVar39._24_4_ = auVar87._24_4_ * local_ca0._24_4_;
          auVar39._28_4_ = auVar87._28_4_;
          auVar88 = vfmsub231ps_fma(auVar39,auVar105,auVar106);
          uVar80 = *(undefined4 *)(ray + k * 4 + 0xa0);
          auVar125._4_4_ = uVar80;
          auVar125._0_4_ = uVar80;
          auVar125._8_4_ = uVar80;
          auVar125._12_4_ = uVar80;
          auVar125._16_4_ = uVar80;
          auVar125._20_4_ = uVar80;
          auVar125._24_4_ = uVar80;
          auVar125._28_4_ = uVar80;
          local_b40 = *(float *)(ray + k * 4 + 0xc0);
          auVar40._4_4_ = local_b40 * auVar88._4_4_;
          auVar40._0_4_ = local_b40 * auVar88._0_4_;
          auVar40._8_4_ = local_b40 * auVar88._8_4_;
          auVar40._12_4_ = local_b40 * auVar88._12_4_;
          auVar40._16_4_ = local_b40 * 0.0;
          auVar40._20_4_ = local_b40 * 0.0;
          auVar40._24_4_ = local_b40 * 0.0;
          auVar40._28_4_ = auVar106._28_4_;
          auVar33 = vfmadd231ps_fma(auVar40,auVar125,ZEXT1632(auVar33));
          uVar80 = *(undefined4 *)(ray + k * 4 + 0x80);
          auVar142._4_4_ = uVar80;
          auVar142._0_4_ = uVar80;
          auVar142._8_4_ = uVar80;
          auVar142._12_4_ = uVar80;
          auVar142._16_4_ = uVar80;
          auVar142._20_4_ = uVar80;
          auVar142._24_4_ = uVar80;
          auVar142._28_4_ = uVar80;
          auVar33 = vfmadd231ps_fma(ZEXT1632(auVar33),auVar142,ZEXT1632(auVar83));
          local_b60 = vsubps_avx(auVar86,auVar91);
          local_ba0 = vsubps_avx(auVar84,auVar34);
          auVar114._0_4_ = auVar91._0_4_ + auVar86._0_4_;
          auVar114._4_4_ = auVar91._4_4_ + auVar86._4_4_;
          auVar114._8_4_ = auVar91._8_4_ + auVar86._8_4_;
          auVar114._12_4_ = auVar91._12_4_ + auVar86._12_4_;
          auVar114._16_4_ = auVar91._16_4_ + auVar86._16_4_;
          auVar114._20_4_ = auVar91._20_4_ + auVar86._20_4_;
          auVar114._24_4_ = auVar91._24_4_ + auVar86._24_4_;
          auVar114._28_4_ = auVar91._28_4_ + auVar86._28_4_;
          auVar110._0_4_ = fVar8 + auVar34._0_4_;
          auVar110._4_4_ = fVar9 + auVar34._4_4_;
          auVar110._8_4_ = fVar10 + auVar34._8_4_;
          auVar110._12_4_ = fVar11 + auVar34._12_4_;
          auVar110._16_4_ = fVar12 + auVar34._16_4_;
          auVar110._20_4_ = fVar13 + auVar34._20_4_;
          auVar110._24_4_ = fVar14 + auVar34._24_4_;
          fVar126 = auVar34._28_4_;
          auVar110._28_4_ = fVar112 + fVar126;
          fVar116 = local_ba0._0_4_;
          fVar118 = local_ba0._4_4_;
          auVar41._4_4_ = auVar114._4_4_ * fVar118;
          auVar41._0_4_ = auVar114._0_4_ * fVar116;
          fVar15 = local_ba0._8_4_;
          auVar41._8_4_ = auVar114._8_4_ * fVar15;
          fVar18 = local_ba0._12_4_;
          auVar41._12_4_ = auVar114._12_4_ * fVar18;
          fVar21 = local_ba0._16_4_;
          auVar41._16_4_ = auVar114._16_4_ * fVar21;
          fVar24 = local_ba0._20_4_;
          auVar41._20_4_ = auVar114._20_4_ * fVar24;
          fVar27 = local_ba0._24_4_;
          auVar41._24_4_ = auVar114._24_4_ * fVar27;
          auVar41._28_4_ = fVar112;
          auVar88 = vfmsub231ps_fma(auVar41,local_b60,auVar110);
          local_b80 = vsubps_avx(local_c80,auVar85);
          fVar112 = local_b80._0_4_;
          fVar119 = local_b80._4_4_;
          auVar42._4_4_ = auVar110._4_4_ * fVar119;
          auVar42._0_4_ = auVar110._0_4_ * fVar112;
          fVar16 = local_b80._8_4_;
          auVar42._8_4_ = auVar110._8_4_ * fVar16;
          fVar19 = local_b80._12_4_;
          auVar42._12_4_ = auVar110._12_4_ * fVar19;
          fVar22 = local_b80._16_4_;
          auVar42._16_4_ = auVar110._16_4_ * fVar22;
          fVar25 = local_b80._20_4_;
          auVar42._20_4_ = auVar110._20_4_ * fVar25;
          fVar28 = local_b80._24_4_;
          auVar42._24_4_ = auVar110._24_4_ * fVar28;
          auVar42._28_4_ = auVar110._28_4_;
          auVar128._0_4_ = local_c80._0_4_ + auVar85._0_4_;
          auVar128._4_4_ = local_c80._4_4_ + auVar85._4_4_;
          auVar128._8_4_ = local_c80._8_4_ + auVar85._8_4_;
          auVar128._12_4_ = local_c80._12_4_ + auVar85._12_4_;
          auVar128._16_4_ = local_c80._16_4_ + auVar85._16_4_;
          auVar128._20_4_ = local_c80._20_4_ + auVar85._20_4_;
          auVar128._24_4_ = local_c80._24_4_ + auVar85._24_4_;
          auVar128._28_4_ = local_c80._28_4_ + auVar85._28_4_;
          auVar83 = vfmsub231ps_fma(auVar42,local_ba0,auVar128);
          fVar117 = local_b60._0_4_;
          fVar120 = local_b60._4_4_;
          auVar43._4_4_ = auVar128._4_4_ * fVar120;
          auVar43._0_4_ = auVar128._0_4_ * fVar117;
          fVar17 = local_b60._8_4_;
          auVar43._8_4_ = auVar128._8_4_ * fVar17;
          fVar20 = local_b60._12_4_;
          auVar43._12_4_ = auVar128._12_4_ * fVar20;
          fVar23 = local_b60._16_4_;
          auVar43._16_4_ = auVar128._16_4_ * fVar23;
          fVar26 = local_b60._20_4_;
          auVar43._20_4_ = auVar128._20_4_ * fVar26;
          fVar29 = local_b60._24_4_;
          auVar43._24_4_ = auVar128._24_4_ * fVar29;
          auVar43._28_4_ = auVar128._28_4_;
          auVar89 = vfmsub231ps_fma(auVar43,local_b80,auVar114);
          auVar44._4_4_ = auVar89._4_4_ * local_b40;
          auVar44._0_4_ = auVar89._0_4_ * local_b40;
          auVar44._8_4_ = auVar89._8_4_ * local_b40;
          auVar44._12_4_ = auVar89._12_4_ * local_b40;
          auVar44._16_4_ = local_b40 * 0.0;
          auVar44._20_4_ = local_b40 * 0.0;
          auVar44._24_4_ = local_b40 * 0.0;
          auVar44._28_4_ = fVar126;
          auVar83 = vfmadd231ps_fma(auVar44,auVar125,ZEXT1632(auVar83));
          auVar83 = vfmadd231ps_fma(ZEXT1632(auVar83),auVar142,ZEXT1632(auVar88));
          auVar36 = vsubps_avx(auVar85,auVar92);
          auVar100._0_4_ = auVar85._0_4_ + auVar92._0_4_;
          auVar100._4_4_ = auVar85._4_4_ + auVar92._4_4_;
          auVar100._8_4_ = auVar85._8_4_ + auVar92._8_4_;
          auVar100._12_4_ = auVar85._12_4_ + auVar92._12_4_;
          auVar100._16_4_ = auVar85._16_4_ + auVar92._16_4_;
          auVar100._20_4_ = auVar85._20_4_ + auVar92._20_4_;
          auVar100._24_4_ = auVar85._24_4_ + auVar92._24_4_;
          auVar100._28_4_ = auVar85._28_4_ + auVar92._28_4_;
          auVar92 = vsubps_avx(auVar91,auVar99);
          auVar115._0_4_ = auVar91._0_4_ + auVar99._0_4_;
          auVar115._4_4_ = auVar91._4_4_ + auVar99._4_4_;
          auVar115._8_4_ = auVar91._8_4_ + auVar99._8_4_;
          auVar115._12_4_ = auVar91._12_4_ + auVar99._12_4_;
          auVar115._16_4_ = auVar91._16_4_ + auVar99._16_4_;
          auVar115._20_4_ = auVar91._20_4_ + auVar99._20_4_;
          auVar115._24_4_ = auVar91._24_4_ + auVar99._24_4_;
          auVar115._28_4_ = auVar91._28_4_ + auVar99._28_4_;
          auVar99 = vsubps_avx(auVar34,auVar35);
          auVar93._0_4_ = auVar34._0_4_ + auVar35._0_4_;
          auVar93._4_4_ = auVar34._4_4_ + auVar35._4_4_;
          auVar93._8_4_ = auVar34._8_4_ + auVar35._8_4_;
          auVar93._12_4_ = auVar34._12_4_ + auVar35._12_4_;
          auVar93._16_4_ = auVar34._16_4_ + auVar35._16_4_;
          auVar93._20_4_ = auVar34._20_4_ + auVar35._20_4_;
          auVar93._24_4_ = auVar34._24_4_ + auVar35._24_4_;
          auVar93._28_4_ = fVar126 + fVar130;
          auVar34._4_4_ = auVar99._4_4_ * auVar115._4_4_;
          auVar34._0_4_ = auVar99._0_4_ * auVar115._0_4_;
          auVar34._8_4_ = auVar99._8_4_ * auVar115._8_4_;
          auVar34._12_4_ = auVar99._12_4_ * auVar115._12_4_;
          auVar34._16_4_ = auVar99._16_4_ * auVar115._16_4_;
          auVar34._20_4_ = auVar99._20_4_ * auVar115._20_4_;
          auVar34._24_4_ = auVar99._24_4_ * auVar115._24_4_;
          auVar34._28_4_ = fVar130;
          auVar89 = vfmsub231ps_fma(auVar34,auVar92,auVar93);
          auVar35._4_4_ = auVar93._4_4_ * auVar36._4_4_;
          auVar35._0_4_ = auVar93._0_4_ * auVar36._0_4_;
          auVar35._8_4_ = auVar93._8_4_ * auVar36._8_4_;
          auVar35._12_4_ = auVar93._12_4_ * auVar36._12_4_;
          auVar35._16_4_ = auVar93._16_4_ * auVar36._16_4_;
          auVar35._20_4_ = auVar93._20_4_ * auVar36._20_4_;
          auVar35._24_4_ = auVar93._24_4_ * auVar36._24_4_;
          auVar35._28_4_ = auVar93._28_4_;
          auVar88 = vfmsub231ps_fma(auVar35,auVar99,auVar100);
          auVar45._4_4_ = auVar92._4_4_ * auVar100._4_4_;
          auVar45._0_4_ = auVar92._0_4_ * auVar100._0_4_;
          auVar45._8_4_ = auVar92._8_4_ * auVar100._8_4_;
          auVar45._12_4_ = auVar92._12_4_ * auVar100._12_4_;
          auVar45._16_4_ = auVar92._16_4_ * auVar100._16_4_;
          auVar45._20_4_ = auVar92._20_4_ * auVar100._20_4_;
          auVar45._24_4_ = auVar92._24_4_ * auVar100._24_4_;
          auVar45._28_4_ = auVar100._28_4_;
          auVar90 = vfmsub231ps_fma(auVar45,auVar36,auVar115);
          auVar101._0_4_ = local_b40 * auVar90._0_4_;
          auVar101._4_4_ = local_b40 * auVar90._4_4_;
          auVar101._8_4_ = local_b40 * auVar90._8_4_;
          auVar101._12_4_ = local_b40 * auVar90._12_4_;
          auVar101._16_4_ = local_b40 * 0.0;
          auVar101._20_4_ = local_b40 * 0.0;
          auVar101._24_4_ = local_b40 * 0.0;
          auVar101._28_4_ = 0;
          auVar88 = vfmadd231ps_fma(auVar101,auVar125,ZEXT1632(auVar88));
          auVar88 = vfmadd231ps_fma(ZEXT1632(auVar88),auVar142,ZEXT1632(auVar89));
          local_ae0 = auVar33._0_4_;
          fStack_adc = auVar33._4_4_;
          fStack_ad8 = auVar33._8_4_;
          fStack_ad4 = auVar33._12_4_;
          local_aa0 = ZEXT1632(CONCAT412(auVar88._12_4_ + fStack_ad4 + auVar83._12_4_,
                                         CONCAT48(auVar88._8_4_ + fStack_ad8 + auVar83._8_4_,
                                                  CONCAT44(auVar88._4_4_ +
                                                           fStack_adc + auVar83._4_4_,
                                                           auVar88._0_4_ + local_ae0 + auVar83._0_4_
                                                          ))));
          auVar94._8_4_ = 0x7fffffff;
          auVar94._0_8_ = 0x7fffffff7fffffff;
          auVar94._12_4_ = 0x7fffffff;
          auVar94._16_4_ = 0x7fffffff;
          auVar94._20_4_ = 0x7fffffff;
          auVar94._24_4_ = 0x7fffffff;
          auVar94._28_4_ = 0x7fffffff;
          local_bc0 = ZEXT1632(auVar33);
          auVar84 = vminps_avx(local_bc0,ZEXT1632(auVar83));
          auVar84 = vminps_avx(auVar84,ZEXT1632(auVar88));
          local_be0 = vandps_avx(local_aa0,auVar94);
          fVar126 = local_be0._0_4_ * 1.1920929e-07;
          fVar130 = local_be0._4_4_ * 1.1920929e-07;
          auVar46._4_4_ = fVar130;
          auVar46._0_4_ = fVar126;
          fVar131 = local_be0._8_4_ * 1.1920929e-07;
          auVar46._8_4_ = fVar131;
          fVar132 = local_be0._12_4_ * 1.1920929e-07;
          auVar46._12_4_ = fVar132;
          fVar133 = local_be0._16_4_ * 1.1920929e-07;
          auVar46._16_4_ = fVar133;
          fVar134 = local_be0._20_4_ * 1.1920929e-07;
          auVar46._20_4_ = fVar134;
          fVar135 = local_be0._24_4_ * 1.1920929e-07;
          auVar46._24_4_ = fVar135;
          auVar46._28_4_ = 0x34000000;
          auVar122._0_8_ = CONCAT44(fVar130,fVar126) ^ 0x8000000080000000;
          auVar122._8_4_ = -fVar131;
          auVar122._12_4_ = -fVar132;
          auVar122._16_4_ = -fVar133;
          auVar122._20_4_ = -fVar134;
          auVar122._24_4_ = -fVar135;
          auVar122._28_4_ = 0xb4000000;
          auVar84 = vcmpps_avx(auVar84,auVar122,5);
          auVar91 = vmaxps_avx(local_bc0,ZEXT1632(auVar83));
          auVar85 = vmaxps_avx(auVar91,ZEXT1632(auVar88));
          auVar85 = vcmpps_avx(auVar85,auVar46,2);
          auVar85 = vorps_avx(auVar84,auVar85);
          if ((((((((auVar85 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar85 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar85 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar85 >> 0x7f,0) != '\0') ||
                (auVar85 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB321(auVar85 >> 0xbf,0) != '\0') ||
              (auVar85 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar85[0x1f] < '\0') {
            auVar47._4_4_ = fVar120 * auVar108._4_4_;
            auVar47._0_4_ = fVar117 * auVar108._0_4_;
            auVar47._8_4_ = fVar17 * auVar108._8_4_;
            auVar47._12_4_ = fVar20 * auVar108._12_4_;
            auVar47._16_4_ = fVar23 * auVar108._16_4_;
            auVar47._20_4_ = fVar26 * auVar108._20_4_;
            auVar47._24_4_ = fVar29 * auVar108._24_4_;
            auVar47._28_4_ = auVar84._28_4_;
            auVar48._4_4_ = fVar119 * local_ca0._4_4_;
            auVar48._0_4_ = fVar112 * local_ca0._0_4_;
            auVar48._8_4_ = fVar16 * local_ca0._8_4_;
            auVar48._12_4_ = fVar19 * local_ca0._12_4_;
            auVar48._16_4_ = fVar22 * local_ca0._16_4_;
            auVar48._20_4_ = fVar25 * local_ca0._20_4_;
            auVar48._24_4_ = fVar28 * local_ca0._24_4_;
            auVar48._28_4_ = 0x34000000;
            auVar33 = vfmsub213ps_fma(local_ca0,local_ba0,auVar47);
            auVar49._4_4_ = auVar92._4_4_ * fVar118;
            auVar49._0_4_ = auVar92._0_4_ * fVar116;
            auVar49._8_4_ = auVar92._8_4_ * fVar15;
            auVar49._12_4_ = auVar92._12_4_ * fVar18;
            auVar49._16_4_ = auVar92._16_4_ * fVar21;
            auVar49._20_4_ = auVar92._20_4_ * fVar24;
            auVar49._24_4_ = auVar92._24_4_ * fVar27;
            auVar49._28_4_ = auVar91._28_4_;
            auVar50._4_4_ = fVar119 * auVar99._4_4_;
            auVar50._0_4_ = fVar112 * auVar99._0_4_;
            auVar50._8_4_ = fVar16 * auVar99._8_4_;
            auVar50._12_4_ = fVar19 * auVar99._12_4_;
            auVar50._16_4_ = fVar22 * auVar99._16_4_;
            auVar50._20_4_ = fVar25 * auVar99._20_4_;
            auVar50._24_4_ = fVar28 * auVar99._24_4_;
            auVar50._28_4_ = local_be0._28_4_;
            auVar88 = vfmsub213ps_fma(auVar99,local_b60,auVar49);
            auVar84 = vandps_avx(auVar47,auVar94);
            auVar91 = vandps_avx(auVar49,auVar94);
            auVar84 = vcmpps_avx(auVar84,auVar91,1);
            local_a80 = vblendvps_avx(ZEXT1632(auVar88),ZEXT1632(auVar33),auVar84);
            auVar51._4_4_ = fVar120 * auVar36._4_4_;
            auVar51._0_4_ = fVar117 * auVar36._0_4_;
            auVar51._8_4_ = fVar17 * auVar36._8_4_;
            auVar51._12_4_ = fVar20 * auVar36._12_4_;
            auVar51._16_4_ = fVar23 * auVar36._16_4_;
            auVar51._20_4_ = fVar26 * auVar36._20_4_;
            auVar51._24_4_ = fVar29 * auVar36._24_4_;
            auVar51._28_4_ = auVar84._28_4_;
            auVar33 = vfmsub213ps_fma(auVar36,local_ba0,auVar50);
            auVar52._4_4_ = auVar105._4_4_ * fVar118;
            auVar52._0_4_ = auVar105._0_4_ * fVar116;
            auVar52._8_4_ = auVar105._8_4_ * fVar15;
            auVar52._12_4_ = auVar105._12_4_ * fVar18;
            auVar52._16_4_ = auVar105._16_4_ * fVar21;
            auVar52._20_4_ = auVar105._20_4_ * fVar24;
            auVar52._24_4_ = auVar105._24_4_ * fVar27;
            auVar52._28_4_ = auVar91._28_4_;
            auVar88 = vfmsub213ps_fma(auVar108,local_b80,auVar52);
            auVar84 = vandps_avx(auVar52,auVar94);
            auVar91 = vandps_avx(auVar50,auVar94);
            auVar84 = vcmpps_avx(auVar84,auVar91,1);
            local_a60 = vblendvps_avx(ZEXT1632(auVar33),ZEXT1632(auVar88),auVar84);
            auVar33 = vfmsub213ps_fma(auVar105,local_b60,auVar48);
            auVar88 = vfmsub213ps_fma(auVar92,local_b80,auVar51);
            auVar84 = vandps_avx(auVar48,auVar94);
            auVar91 = vandps_avx(auVar51,auVar94);
            auVar84 = vcmpps_avx(auVar84,auVar91,1);
            local_a40 = vblendvps_avx(ZEXT1632(auVar88),ZEXT1632(auVar33),auVar84);
            auVar33 = vpackssdw_avx(auVar85._0_16_,auVar85._16_16_);
            fVar112 = local_a40._0_4_;
            auVar95._0_4_ = fVar112 * local_b40;
            fVar126 = local_a40._4_4_;
            auVar95._4_4_ = fVar126 * local_b40;
            fVar116 = local_a40._8_4_;
            auVar95._8_4_ = fVar116 * local_b40;
            fVar117 = local_a40._12_4_;
            auVar95._12_4_ = fVar117 * local_b40;
            fVar118 = local_a40._16_4_;
            auVar95._16_4_ = fVar118 * local_b40;
            fVar119 = local_a40._20_4_;
            auVar95._20_4_ = fVar119 * local_b40;
            fVar120 = local_a40._24_4_;
            auVar95._24_4_ = fVar120 * local_b40;
            auVar95._28_4_ = 0;
            auVar88 = vfmadd213ps_fma(auVar125,local_a60,auVar95);
            auVar88 = vfmadd213ps_fma(auVar142,local_a80,ZEXT1632(auVar88));
            auVar91 = ZEXT1632(CONCAT412(auVar88._12_4_ + auVar88._12_4_,
                                         CONCAT48(auVar88._8_4_ + auVar88._8_4_,
                                                  CONCAT44(auVar88._4_4_ + auVar88._4_4_,
                                                           auVar88._0_4_ + auVar88._0_4_))));
            auVar53._4_4_ = fVar126 * fVar9;
            auVar53._0_4_ = fVar112 * fVar8;
            auVar53._8_4_ = fVar116 * fVar10;
            auVar53._12_4_ = fVar117 * fVar11;
            auVar53._16_4_ = fVar118 * fVar12;
            auVar53._20_4_ = fVar119 * fVar13;
            auVar53._24_4_ = fVar120 * fVar14;
            auVar53._28_4_ = auVar85._28_4_;
            auVar88 = vfmadd213ps_fma(auVar86,local_a60,auVar53);
            auVar89 = vfmadd213ps_fma(local_c80,local_a80,ZEXT1632(auVar88));
            auVar84 = vrcpps_avx(auVar91);
            auVar138._8_4_ = 0x3f800000;
            auVar138._0_8_ = &DAT_3f8000003f800000;
            auVar138._12_4_ = 0x3f800000;
            auVar138._16_4_ = 0x3f800000;
            auVar138._20_4_ = 0x3f800000;
            auVar138._24_4_ = 0x3f800000;
            auVar138._28_4_ = 0x3f800000;
            auVar88 = vfnmadd213ps_fma(auVar84,auVar91,auVar138);
            auVar88 = vfmadd132ps_fma(ZEXT1632(auVar88),auVar84,auVar84);
            local_9c0 = ZEXT1632(CONCAT412(auVar88._12_4_ * (auVar89._12_4_ + auVar89._12_4_),
                                           CONCAT48(auVar88._8_4_ * (auVar89._8_4_ + auVar89._8_4_),
                                                    CONCAT44(auVar88._4_4_ *
                                                             (auVar89._4_4_ + auVar89._4_4_),
                                                             auVar88._0_4_ *
                                                             (auVar89._0_4_ + auVar89._0_4_)))));
            uVar80 = *(undefined4 *)(ray + k * 4 + 0x60);
            auVar129._4_4_ = uVar80;
            auVar129._0_4_ = uVar80;
            auVar129._8_4_ = uVar80;
            auVar129._12_4_ = uVar80;
            auVar129._16_4_ = uVar80;
            auVar129._20_4_ = uVar80;
            auVar129._24_4_ = uVar80;
            auVar129._28_4_ = uVar80;
            uVar80 = *(undefined4 *)(ray + k * 4 + 0x100);
            auVar137._4_4_ = uVar80;
            auVar137._0_4_ = uVar80;
            auVar137._8_4_ = uVar80;
            auVar137._12_4_ = uVar80;
            auVar137._16_4_ = uVar80;
            auVar137._20_4_ = uVar80;
            auVar137._24_4_ = uVar80;
            auVar137._28_4_ = uVar80;
            auVar84 = vcmpps_avx(auVar129,local_9c0,2);
            auVar85 = vcmpps_avx(local_9c0,auVar137,2);
            auVar84 = vandps_avx(auVar84,auVar85);
            auVar88 = vpackssdw_avx(auVar84._0_16_,auVar84._16_16_);
            auVar33 = vpand_avx(auVar88,auVar33);
            auVar84 = vpmovsxwd_avx2(auVar33);
            if ((((((((auVar84 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                     (auVar84 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                    (auVar84 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                   SUB321(auVar84 >> 0x7f,0) != '\0') ||
                  (auVar84 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                 SUB321(auVar84 >> 0xbf,0) != '\0') ||
                (auVar84 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                auVar84[0x1f] < '\0') {
              auVar84 = vcmpps_avx(auVar91,_DAT_02020f00,4);
              auVar88 = vpackssdw_avx(auVar84._0_16_,auVar84._16_16_);
              auVar33 = vpand_avx(auVar33,auVar88);
              local_a20 = vpmovsxwd_avx2(auVar33);
              if ((((((((local_a20 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                       (local_a20 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                      (local_a20 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                     SUB321(local_a20 >> 0x7f,0) != '\0') ||
                    (local_a20 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                   SUB321(local_a20 >> 0xbf,0) != '\0') ||
                  (local_a20 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                  local_a20[0x1f] < '\0') {
                uStack_ad0 = 0;
                uStack_acc = 0;
                uStack_ac8 = 0;
                uStack_ac4 = 0;
                local_ac0 = ZEXT1632(auVar83);
                local_940 = local_c00;
                pSVar5 = context->scene;
                auVar84 = vrcpps_avx(local_aa0);
                auVar111._8_4_ = 0x3f800000;
                auVar111._0_8_ = &DAT_3f8000003f800000;
                auVar111._12_4_ = 0x3f800000;
                auVar111._16_4_ = 0x3f800000;
                auVar111._20_4_ = 0x3f800000;
                auVar111._24_4_ = 0x3f800000;
                auVar111._28_4_ = 0x3f800000;
                auVar88 = vfnmadd213ps_fma(local_aa0,auVar84,auVar111);
                auVar88 = vfmadd132ps_fma(ZEXT1632(auVar88),auVar84,auVar84);
                auVar102._8_4_ = 0x219392ef;
                auVar102._0_8_ = 0x219392ef219392ef;
                auVar102._12_4_ = 0x219392ef;
                auVar102._16_4_ = 0x219392ef;
                auVar102._20_4_ = 0x219392ef;
                auVar102._24_4_ = 0x219392ef;
                auVar102._28_4_ = 0x219392ef;
                auVar84 = vcmpps_avx(local_be0,auVar102,5);
                auVar84 = vandps_avx(auVar84,ZEXT1632(auVar88));
                auVar54._4_4_ = fStack_adc * auVar84._4_4_;
                auVar54._0_4_ = local_ae0 * auVar84._0_4_;
                auVar54._8_4_ = fStack_ad8 * auVar84._8_4_;
                auVar54._12_4_ = fStack_ad4 * auVar84._12_4_;
                auVar54._16_4_ = auVar84._16_4_ * 0.0;
                auVar54._20_4_ = auVar84._20_4_ * 0.0;
                auVar54._24_4_ = auVar84._24_4_ * 0.0;
                auVar54._28_4_ = 0;
                auVar85 = vminps_avx(auVar54,auVar111);
                auVar55._4_4_ = auVar83._4_4_ * auVar84._4_4_;
                auVar55._0_4_ = auVar83._0_4_ * auVar84._0_4_;
                auVar55._8_4_ = auVar83._8_4_ * auVar84._8_4_;
                auVar55._12_4_ = auVar83._12_4_ * auVar84._12_4_;
                auVar55._16_4_ = auVar84._16_4_ * 0.0;
                auVar55._20_4_ = auVar84._20_4_ * 0.0;
                auVar55._24_4_ = auVar84._24_4_ * 0.0;
                auVar55._28_4_ = auVar84._28_4_;
                auVar84 = vminps_avx(auVar55,auVar111);
                auVar91 = vsubps_avx(auVar111,auVar85);
                auVar86 = vsubps_avx(auVar111,auVar84);
                local_9e0 = vblendvps_avx(auVar84,auVar91,local_c00);
                local_a00 = vblendvps_avx(auVar85,auVar86,local_c00);
                local_980._4_4_ = (float)local_c20._4_4_ * local_a60._4_4_;
                local_980._0_4_ = (float)local_c20._0_4_ * local_a60._0_4_;
                local_980._8_4_ = fStack_c18 * local_a60._8_4_;
                local_980._12_4_ = fStack_c14 * local_a60._12_4_;
                local_980._16_4_ = fStack_c10 * local_a60._16_4_;
                local_980._20_4_ = fStack_c0c * local_a60._20_4_;
                local_980._24_4_ = fStack_c08 * local_a60._24_4_;
                local_980._28_4_ = local_9e0._28_4_;
                local_9a0[0] = local_a80._0_4_ * (float)local_c20._0_4_;
                local_9a0[1] = local_a80._4_4_ * (float)local_c20._4_4_;
                local_9a0[2] = local_a80._8_4_ * fStack_c18;
                local_9a0[3] = local_a80._12_4_ * fStack_c14;
                fStack_990 = local_a80._16_4_ * fStack_c10;
                fStack_98c = local_a80._20_4_ * fStack_c0c;
                fStack_988 = local_a80._24_4_ * fStack_c08;
                uStack_984 = local_a00._28_4_;
                local_960[0] = (float)local_c20._0_4_ * fVar112;
                local_960[1] = (float)local_c20._4_4_ * fVar126;
                local_960[2] = fStack_c18 * fVar116;
                local_960[3] = fStack_c14 * fVar117;
                fStack_950 = fStack_c10 * fVar118;
                fStack_94c = fStack_c0c * fVar119;
                fStack_948 = fStack_c08 * fVar120;
                uStack_944 = uStack_c04;
                auVar33 = vpacksswb_avx(auVar33,auVar33);
                uVar78 = (ulong)(byte)(SUB161(auVar33 >> 7,0) & 1 |
                                       (SUB161(auVar33 >> 0xf,0) & 1) << 1 |
                                       (SUB161(auVar33 >> 0x17,0) & 1) << 2 |
                                       (SUB161(auVar33 >> 0x1f,0) & 1) << 3 |
                                       (SUB161(auVar33 >> 0x27,0) & 1) << 4 |
                                       (SUB161(auVar33 >> 0x2f,0) & 1) << 5 |
                                       (SUB161(auVar33 >> 0x37,0) & 1) << 6 |
                                      SUB161(auVar33 >> 0x3f,0) << 7);
                fStack_b3c = local_b40;
                fStack_b38 = local_b40;
                fStack_b34 = local_b40;
                fStack_b30 = local_b40;
                fStack_b2c = local_b40;
                fStack_b28 = local_b40;
                fStack_b24 = local_b40;
                do {
                  uVar37 = 0;
                  for (uVar70 = uVar78; (uVar70 & 1) == 0; uVar70 = uVar70 >> 1 | 0x8000000000000000
                      ) {
                    uVar37 = uVar37 + 1;
                  }
                  uVar79 = *(uint *)((long)&local_b00 + uVar37 * 4);
                  pGVar6 = (pSVar5->geometries).items[uVar79].ptr;
                  if ((pGVar6->mask & *(uint *)(ray + k * 4 + 0x120)) == 0) {
                    uVar78 = uVar78 ^ 1L << (uVar37 & 0x3f);
                    bVar82 = true;
                  }
                  else if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                          (pGVar6->occlusionFilterN == (RTCFilterFunctionN)0x0)) {
                    bVar82 = false;
                  }
                  else {
                    local_c80._0_4_ = *(undefined4 *)(ray + k * 4 + 0x100);
                    uVar70 = (ulong)(uint)((int)uVar37 * 4);
                    local_8c0 = *(undefined4 *)(local_a00 + uVar70);
                    uVar80 = *(undefined4 *)(local_9e0 + uVar70);
                    local_8a0._4_4_ = uVar80;
                    local_8a0._0_4_ = uVar80;
                    local_8a0._8_4_ = uVar80;
                    local_8a0._12_4_ = uVar80;
                    local_8a0._16_4_ = uVar80;
                    local_8a0._20_4_ = uVar80;
                    local_8a0._24_4_ = uVar80;
                    local_8a0._28_4_ = uVar80;
                    *(undefined4 *)(ray + k * 4 + 0x100) = *(undefined4 *)(local_9c0 + uVar70);
                    local_cd0.context = context->user;
                    local_880 = *(undefined4 *)((long)&local_b20 + uVar70);
                    local_920 = *(undefined4 *)((long)local_9a0 + uVar70);
                    uVar80 = *(undefined4 *)(local_980 + uVar70);
                    local_900._4_4_ = uVar80;
                    local_900._0_4_ = uVar80;
                    local_900._8_4_ = uVar80;
                    local_900._12_4_ = uVar80;
                    local_900._16_4_ = uVar80;
                    local_900._20_4_ = uVar80;
                    local_900._24_4_ = uVar80;
                    local_900._28_4_ = uVar80;
                    uVar80 = *(undefined4 *)((long)local_960 + uVar70);
                    local_8e0._4_4_ = uVar80;
                    local_8e0._0_4_ = uVar80;
                    local_8e0._8_4_ = uVar80;
                    local_8e0._12_4_ = uVar80;
                    local_8e0._16_4_ = uVar80;
                    local_8e0._20_4_ = uVar80;
                    local_8e0._24_4_ = uVar80;
                    local_8e0._28_4_ = uVar80;
                    local_860._4_4_ = uVar79;
                    local_860._0_4_ = uVar79;
                    local_860._8_4_ = uVar79;
                    local_860._12_4_ = uVar79;
                    local_860._16_4_ = uVar79;
                    local_860._20_4_ = uVar79;
                    local_860._24_4_ = uVar79;
                    local_860._28_4_ = uVar79;
                    uStack_91c = local_920;
                    uStack_918 = local_920;
                    uStack_914 = local_920;
                    uStack_910 = local_920;
                    uStack_90c = local_920;
                    uStack_908 = local_920;
                    uStack_904 = local_920;
                    uStack_8bc = local_8c0;
                    uStack_8b8 = local_8c0;
                    uStack_8b4 = local_8c0;
                    uStack_8b0 = local_8c0;
                    uStack_8ac = local_8c0;
                    uStack_8a8 = local_8c0;
                    uStack_8a4 = local_8c0;
                    uStack_87c = local_880;
                    uStack_878 = local_880;
                    uStack_874 = local_880;
                    uStack_870 = local_880;
                    uStack_86c = local_880;
                    uStack_868 = local_880;
                    uStack_864 = local_880;
                    auVar84 = vpcmpeqd_avx2(local_8a0,local_8a0);
                    uStack_83c = (local_cd0.context)->instID[0];
                    local_840 = uStack_83c;
                    uStack_838 = uStack_83c;
                    uStack_834 = uStack_83c;
                    uStack_830 = uStack_83c;
                    uStack_82c = uStack_83c;
                    uStack_828 = uStack_83c;
                    uStack_824 = uStack_83c;
                    uStack_81c = (local_cd0.context)->instPrimID[0];
                    local_820 = uStack_81c;
                    uStack_818 = uStack_81c;
                    uStack_814 = uStack_81c;
                    uStack_810 = uStack_81c;
                    uStack_80c = uStack_81c;
                    uStack_808 = uStack_81c;
                    uStack_804 = uStack_81c;
                    local_c60 = local_c40._0_8_;
                    uStack_c58 = local_c40._8_8_;
                    uStack_c50 = local_c40._16_8_;
                    uStack_c48 = local_c40._24_8_;
                    local_cd0.valid = (int *)&local_c60;
                    local_cd0.geometryUserPtr = pGVar6->userPtr;
                    local_cd0.hit = (RTCHitN *)&local_920;
                    local_cd0.N = 8;
                    local_cd0.ray = (RTCRayN *)ray;
                    if (pGVar6->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                      local_ca0._0_8_ = k;
                      (*pGVar6->occlusionFilterN)(&local_cd0);
                      auVar96._8_56_ = extraout_var;
                      auVar96._0_8_ = extraout_XMM1_Qa;
                      auVar84 = vpcmpeqd_avx2(auVar96._0_32_,auVar96._0_32_);
                      k = local_ca0._0_8_;
                    }
                    auVar64._8_8_ = uStack_c58;
                    auVar64._0_8_ = local_c60;
                    auVar64._16_8_ = uStack_c50;
                    auVar64._24_8_ = uStack_c48;
                    auVar91 = vpcmpeqd_avx2(SUB6432(ZEXT1664((undefined1  [16])0x0),0),auVar64);
                    auVar85 = auVar84 & ~auVar91;
                    if ((((((((auVar85 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                             (auVar85 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                            (auVar85 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                           SUB321(auVar85 >> 0x7f,0) == '\0') &&
                          (auVar85 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                         SUB321(auVar85 >> 0xbf,0) == '\0') &&
                        (auVar85 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                        -1 < auVar85[0x1f]) {
                      auVar91 = auVar91 ^ auVar84;
                    }
                    else {
                      p_Var7 = context->args->filter;
                      if ((p_Var7 != (RTCFilterFunctionN)0x0) &&
                         (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                           RTC_RAY_QUERY_FLAG_INCOHERENT ||
                          (((pGVar6->field_8).field_0x2 & 0x40) != 0)))) {
                        (*p_Var7)(&local_cd0);
                      }
                      auVar65._8_8_ = uStack_c58;
                      auVar65._0_8_ = local_c60;
                      auVar65._16_8_ = uStack_c50;
                      auVar65._24_8_ = uStack_c48;
                      auVar84 = vpcmpeqd_avx2(SUB6432(ZEXT1664((undefined1  [16])0x0),0),auVar65);
                      auVar91 = auVar84 ^ _DAT_0205a980;
                      auVar103._8_4_ = 0xff800000;
                      auVar103._0_8_ = 0xff800000ff800000;
                      auVar103._12_4_ = 0xff800000;
                      auVar103._16_4_ = 0xff800000;
                      auVar103._20_4_ = 0xff800000;
                      auVar103._24_4_ = 0xff800000;
                      auVar103._28_4_ = 0xff800000;
                      auVar84 = vblendvps_avx(auVar103,*(undefined1 (*) [32])(local_cd0.ray + 0x100)
                                              ,auVar84);
                      *(undefined1 (*) [32])(local_cd0.ray + 0x100) = auVar84;
                    }
                    bVar62 = (auVar91 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0;
                    bVar63 = (auVar91 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0;
                    bVar61 = (auVar91 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0;
                    bVar60 = SUB321(auVar91 >> 0x7f,0) == '\0';
                    bVar59 = (auVar91 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0;
                    bVar58 = SUB321(auVar91 >> 0xbf,0) == '\0';
                    bVar57 = (auVar91 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0;
                    bVar56 = -1 < auVar91[0x1f];
                    bVar82 = ((((((bVar62 && bVar63) && bVar61) && bVar60) && bVar59) && bVar58) &&
                             bVar57) && bVar56;
                    if (((((((bVar62 && bVar63) && bVar61) && bVar60) && bVar59) && bVar58) &&
                        bVar57) && bVar56) {
                      *(undefined4 *)(ray + k * 4 + 0x100) = local_c80._0_4_;
                      uVar78 = uVar78 ^ 1L << (uVar37 & 0x3f);
                    }
                  }
                  uVar79 = 0;
                  if (!bVar82) {
                    if (bVar81) {
                      *(undefined4 *)(ray + k * 4 + 0x100) = 0xff800000;
                      uVar79 = 1;
                    }
                    goto LAB_005f8189;
                  }
                } while (uVar78 != 0);
              }
            }
          }
          uVar79 = 0;
          uVar72 = uVar72 + 1;
          bVar81 = uVar72 < uVar67;
        } while (uVar72 != uVar67);
      }
    }
LAB_005f8189:
  } while ((uVar79 & 3) == 0);
  return puVar74 != &local_800;
}

Assistant:

bool BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::occluded1(Accel::Intersectors* This,
                                                                                               const BVH* bvh,
                                                                                               NodeRef root,
                                                                                               size_t k,
                                                                                               Precalculations& pre,
                                                                                               RayK<K>& ray,
                                                                                               const TravRayK<K, robust>& tray,
                                                                                               RayQueryContext* context)
      {
        /* stack state */
        NodeRef stack[stackSizeSingle];  // stack of nodes that still need to get traversed
        NodeRef* stackPtr = stack+1;     // current stack pointer
	NodeRef* stackEnd = stack+stackSizeSingle;
        stack[0] = root;

        /* load the ray into SIMD registers */
        TravRay<N,robust> tray1;
        tray1.template init<K>(k, tray.org, tray.dir, tray.rdir, tray.nearXYZ, tray.tnear[k], tray.tfar[k]);

	/* pop loop */
	while (true) pop:
	{
          /* pop next node */
	  if (unlikely(stackPtr == stack)) break;
	  stackPtr--;
          NodeRef cur = (NodeRef)*stackPtr;

          /* downtraversal loop */
          while (true)
          {
            /* intersect node */
            size_t mask; vfloat<N> tNear;
            STAT3(shadow.trav_nodes, 1, 1, 1);
            bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray1, ray.time()[k], tNear, mask);
            if (unlikely(!nodeIntersected)) { STAT3(shadow.trav_nodes,-1,-1,-1); break; }

            /* if no child is hit, pop next node */
            if (unlikely(mask == 0))
              goto pop;

            /* select next child and push other children */
            BVHNNodeTraverser1Hit<N, types>::traverseAnyHit(cur, mask, tNear, stackPtr, stackEnd);
          }

          /* this is a leaf node */
          assert(cur != BVH::emptyNode);
          STAT3(shadow.trav_leaves, 1, 1, 1);
          size_t num; Primitive* prim = (Primitive*)cur.leaf(num);

          size_t lazy_node = 0;
          if (PrimitiveIntersectorK::occluded(This, pre, ray, k, context, prim, num, tray1, lazy_node)) {
	    ray.tfar[k] = neg_inf;
	    return true;
	  }

          if (unlikely(lazy_node)) {
            *stackPtr = lazy_node;
            stackPtr++;
          }
	}
	return false;
      }